

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  runtime_error *prVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  char *__filename;
  char local_238 [8];
  char _error_msg__1 [256];
  char local_128 [8];
  char _error_msg_ [256];
  FILE *fin;
  char *fname_local;
  Instance *this_local;
  
  __filename = (char *)CONCAT44(in_register_00000034,__fd);
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    perror("fopen");
    snprintf(local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","fin != NULL"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x5f);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_128);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = check_ext(__filename,".vbp");
  if (bVar1) {
    read(this,(int)__stream,(void *)0x0,__nbytes);
  }
  else {
    bVar1 = check_ext(__filename,".mvp");
    if (!bVar1) {
      snprintf(local_238,0x100,"Error: `%s` in \"%s\" line %d","Invalid file extension",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x65);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,local_238);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    read(this,(int)__stream,(void *)0x1,__nbytes);
  }
  iVar2 = fclose(__stream);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void Instance::read(const char *fname) {
	FILE *fin = fopen(fname, "r");
	if (fin == NULL) {
		perror("fopen");
	}
	throw_assert(fin != NULL);
	if (check_ext(fname, ".vbp")) {
		read(fin, VBP);
	} else if (check_ext(fname, ".mvp")) {
		read(fin, MVP);
	} else {
		throw_error("Invalid file extension");
	}
	fclose(fin);
}